

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::InterlockedResourceAccessHandler::handle
          (InterlockedResourceAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t id;
  Compiler *pCVar1;
  bool bVar2;
  uint uVar3;
  StorageClass SVar4;
  SPIRVariable *pSVar5;
  SPIRExpression *pSVar6;
  SPIRVariable *pSVar7;
  SPIRType *pSVar8;
  uint32_t uVar9;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  uint32_t result_type;
  uint32_t result_type_2;
  uint32_t result_type_1;
  
  if (this->use_critical_section != true) {
    uVar3 = opcode - OpAtomicLoad;
    if (0xf < uVar3) {
code_r0x00379c3c:
      switch(opcode) {
      case OpImageTexelPointer:
switchD_00379bc4_caseD_3c:
        if (length < 3) {
          return false;
        }
        result_type_2 = *args;
        uVar9 = args[2];
        local_2f = true;
        pSVar6 = set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                           (this->compiler,args[1],(char (*) [1])0x3930a4,&result_type_2,&local_2f);
        pSVar5 = maybe_get_backing_variable(this->compiler,uVar9);
        if (pSVar5 == (SPIRVariable *)0x0) {
          return true;
        }
        (pSVar6->loaded_from).id = (pSVar5->super_IVariant).self.id;
        return true;
      case OpLoad:
        goto switchD_00379bc4_caseD_3d;
      case OpStore:
        break;
      case OpCopyMemory:
        goto switchD_00379bc4_caseD_3f;
      case OpCopyMemorySized:
        goto LAB_00379d0f;
      case OpAccessChain:
      case OpInBoundsAccessChain:
      case OpPtrAccessChain:
switchD_00379bc4_caseD_41:
        if (length < 3) {
          return false;
        }
        result_type = *args;
        pSVar8 = get<spirv_cross::SPIRType>(this->compiler,result_type);
        if (StorageClassStorageBuffer < pSVar8->storage) {
          return true;
        }
        if ((0x1005U >> (pSVar8->storage & 0x1f) & 1) == 0) {
          return true;
        }
        uVar3 = args[1];
        uVar9 = args[2];
        local_2e = true;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,uVar3,(char (*) [1])0x3930a4,&result_type,&local_2e);
        register_read(this->compiler,uVar3,uVar9,true);
        (this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[uVar3].
        allow_type_rewrite = true;
        return true;
      default:
        if (opcode == OpImageRead) goto LAB_00379d1a;
        if (opcode != OpImageWrite) {
          return true;
        }
      }
      goto switchD_00379bc4_caseD_3e;
    }
    if ((0xffecU >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 0) goto LAB_00379d1a;
      if (uVar3 == 1) goto switchD_00379bc4_caseD_3e;
      goto code_r0x00379c3c;
    }
LAB_00379bdb:
    if (length < 3) {
      return false;
    }
    uVar9 = args[2];
    goto LAB_00379ce2;
  }
  uVar3 = opcode - OpAtomicLoad;
  if (uVar3 < 0x10) {
    if ((0xffecU >> (uVar3 & 0x1f) & 1) != 0) goto LAB_00379bdb;
    if (uVar3 == 0) goto LAB_00379d1a;
    if (uVar3 == 1) goto switchD_00379bc4_caseD_3e;
  }
  switch(opcode) {
  case OpImageTexelPointer:
    goto switchD_00379bc4_caseD_3c;
  case OpLoad:
switchD_00379bc4_caseD_3d:
    if (length < 3) {
      return false;
    }
    uVar9 = args[2];
    pSVar5 = maybe_get_backing_variable(this->compiler,uVar9);
    if (pSVar5 == (SPIRVariable *)0x0) {
      return true;
    }
    SVar4 = pSVar5->storage;
    if (SVar4 != StorageClassStorageBuffer) {
      if (SVar4 != StorageClassUniform) {
        if (SVar4 != StorageClassUniformConstant) {
          return true;
        }
        result_type_1 = *args;
        id = args[1];
        local_2d = true;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,id,(char (*) [1])0x3930a4,&result_type_1,&local_2d);
        register_read(this->compiler,id,uVar9,true);
        return true;
      }
      pCVar1 = this->compiler;
      pSVar8 = get<spirv_cross::SPIRType>(pCVar1,*(uint32_t *)&(pSVar5->super_IVariant).field_0xc);
      bVar2 = ParsedIR::has_decoration
                        (&pCVar1->ir,(ID)(pSVar8->super_IVariant).self.id,DecorationBufferBlock);
      if (!bVar2) {
        return true;
      }
    }
    uVar9 = (pSVar5->super_IVariant).self.id;
    break;
  case OpCopyMemory:
switchD_00379bc4_caseD_3f:
    if (length < 2) {
      return false;
    }
    uVar9 = args[1];
    pSVar7 = maybe_get_backing_variable(this->compiler,*args);
    pSVar5 = maybe_get_backing_variable(this->compiler,uVar9);
    if ((pSVar7 != (SPIRVariable *)0x0) &&
       ((pSVar7->storage == StorageClassStorageBuffer || (pSVar7->storage == StorageClassUniform))))
    {
      access_potential_resource(this,(pSVar7->super_IVariant).self.id);
    }
    if (pSVar5 == (SPIRVariable *)0x0) {
      return true;
    }
    SVar4 = pSVar5->storage;
LAB_00379e6e:
    if (SVar4 != StorageClassStorageBuffer) {
      if (SVar4 != StorageClassUniform) {
        return true;
      }
      pCVar1 = this->compiler;
      pSVar8 = get<spirv_cross::SPIRType>(pCVar1,*(uint32_t *)&(pSVar5->super_IVariant).field_0xc);
      bVar2 = ParsedIR::has_decoration
                        (&pCVar1->ir,(ID)(pSVar8->super_IVariant).self.id,DecorationBufferBlock);
      if (!bVar2) {
        return true;
      }
    }
LAB_00379ea6:
    uVar9 = (pSVar5->super_IVariant).self.id;
    break;
  case OpCopyMemorySized:
    goto LAB_00379d0f;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    goto switchD_00379bc4_caseD_41;
  default:
    if (opcode == OpImageRead) {
LAB_00379d1a:
      if (length < 3) {
        return false;
      }
      pSVar5 = maybe_get_backing_variable(this->compiler,args[2]);
      if (pSVar5 == (SPIRVariable *)0x0) {
        return true;
      }
      SVar4 = pSVar5->storage;
      if (SVar4 != StorageClassUniformConstant) goto LAB_00379e6e;
      goto LAB_00379ea6;
    }
    if (opcode != OpImageWrite) {
      if (opcode == OpEndInvocationInterlockEXT) {
        return false;
      }
      if (opcode != OpBeginInvocationInterlockEXT) {
        return true;
      }
      this->in_crit_sec = true;
      return true;
    }
  case OpStore:
switchD_00379bc4_caseD_3e:
    if (length == 0) {
      return false;
    }
    uVar9 = *args;
LAB_00379ce2:
    pSVar5 = maybe_get_backing_variable(this->compiler,uVar9);
    if (pSVar5 == (SPIRVariable *)0x0) {
      return true;
    }
    if (StorageClassStorageBuffer < pSVar5->storage) {
      return true;
    }
    if ((0x1005U >> (pSVar5->storage & 0x1f) & 1) == 0) {
      return true;
    }
    uVar9 = (pSVar5->super_IVariant).self.id;
  }
  access_potential_resource(this,uVar9);
LAB_00379d0f:
  return true;
}

Assistant:

bool Compiler::InterlockedResourceAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// Only care about critical section analysis if we have simple case.
	if (use_critical_section)
	{
		if (opcode == OpBeginInvocationInterlockEXT)
		{
			in_crit_sec = true;
			return true;
		}

		if (opcode == OpEndInvocationInterlockEXT)
		{
			// End critical section--nothing more to do.
			return false;
		}
	}

	// We need to figure out where images and buffers are loaded from, so do only the bare bones compilation we need.
	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);

		// We're only concerned with buffer and image memory here.
		if (!var)
			break;

		switch (var->storage)
		{
		default:
			break;

		case StorageClassUniformConstant:
		{
			uint32_t result_type = args[0];
			uint32_t id = args[1];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
			break;
		}

		case StorageClassUniform:
			// Must have BufferBlock; we only care about SSBOs.
			if (!compiler.has_decoration(compiler.get<SPIRType>(var->basetype).self, DecorationBufferBlock))
				break;
			// fallthrough
		case StorageClassStorageBuffer:
			access_potential_resource(var->self);
			break;
		}
		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		if (type.storage == StorageClassUniform || type.storage == StorageClassUniformConstant ||
		    type.storage == StorageClassStorageBuffer)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
			compiler.ir.ids[id].set_allow_type_rewrite();
		}
		break;
	}

	case OpImageTexelPointer:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];
		uint32_t id = args[1];
		uint32_t ptr = args[2];
		auto &e = compiler.set<SPIRExpression>(id, "", result_type, true);
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var)
			e.loaded_from = var->self;
		break;
	}

	case OpStore:
	case OpImageWrite:
	case OpAtomicStore:
	{
		if (length < 1)
			return false;

		uint32_t ptr = args[0];
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var && (var->storage == StorageClassUniform || var->storage == StorageClassUniformConstant ||
		            var->storage == StorageClassStorageBuffer))
		{
			access_potential_resource(var->self);
		}

		break;
	}

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		uint32_t dst = args[0];
		uint32_t src = args[1];
		auto *dst_var = compiler.maybe_get_backing_variable(dst);
		auto *src_var = compiler.maybe_get_backing_variable(src);

		if (dst_var && (dst_var->storage == StorageClassUniform || dst_var->storage == StorageClassStorageBuffer))
			access_potential_resource(dst_var->self);

		if (src_var)
		{
			if (src_var->storage != StorageClassUniform && src_var->storage != StorageClassStorageBuffer)
				break;

			if (src_var->storage == StorageClassUniform &&
			    !compiler.has_decoration(compiler.get<SPIRType>(src_var->basetype).self, DecorationBufferBlock))
			{
				break;
			}

			access_potential_resource(src_var->self);
		}

		break;
	}

	case OpImageRead:
	case OpAtomicLoad:
	{
		if (length < 3)
			return false;

		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);

		// We're only concerned with buffer and image memory here.
		if (!var)
			break;

		switch (var->storage)
		{
		default:
			break;

		case StorageClassUniform:
			// Must have BufferBlock; we only care about SSBOs.
			if (!compiler.has_decoration(compiler.get<SPIRType>(var->basetype).self, DecorationBufferBlock))
				break;
			// fallthrough
		case StorageClassUniformConstant:
		case StorageClassStorageBuffer:
			access_potential_resource(var->self);
			break;
		}
		break;
	}

	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	{
		if (length < 3)
			return false;

		uint32_t ptr = args[2];
		auto *var = compiler.maybe_get_backing_variable(ptr);
		if (var && (var->storage == StorageClassUniform || var->storage == StorageClassUniformConstant ||
		            var->storage == StorageClassStorageBuffer))
		{
			access_potential_resource(var->self);
		}

		break;
	}

	default:
		break;
	}

	return true;
}